

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O3

void duckdb::QuantileBindData::Serialize
               (Serializer *serializer,optional_ptr<duckdb::FunctionData,_true> bind_data_p,
               AggregateFunction *function)

{
  Value *pVVar1;
  optional_ptr<duckdb::FunctionData,_true> oVar2;
  QuantileValue *q;
  Value *__args;
  vector<duckdb::Value,_true> raw;
  vector<duckdb::Value,_true> local_48;
  optional_ptr<duckdb::FunctionData,_true> local_30;
  
  local_30.ptr = bind_data_p.ptr;
  optional_ptr<duckdb::FunctionData,_true>::CheckValid(&local_30);
  oVar2 = local_30;
  local_48.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pVVar1 = (Value *)local_30.ptr[2]._vptr_FunctionData;
  for (__args = (Value *)local_30.ptr[1]._vptr_FunctionData; __args != pVVar1;
      __args = (Value *)((long)&__args[1].value_ + 8)) {
    ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::emplace_back<duckdb::Value_const&>
              ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&local_48,__args);
  }
  (*serializer->_vptr_Serializer[2])(serializer,100,"quantiles");
  Serializer::WriteValue<duckdb::Value>(serializer,&local_48);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0x65,"order");
  Serializer::WriteValue<unsigned_long>(serializer,(vector<unsigned_long,_true> *)(oVar2.ptr + 4));
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0x66,"desc");
  (*serializer->_vptr_Serializer[0xe])(serializer,(ulong)*(byte *)&oVar2.ptr[7]._vptr_FunctionData);
  (*serializer->_vptr_Serializer[3])(serializer);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_48);
  return;
}

Assistant:

void QuantileBindData::Serialize(Serializer &serializer, const optional_ptr<FunctionData> bind_data_p,
                                 const AggregateFunction &function) {
	auto &bind_data = bind_data_p->Cast<QuantileBindData>();
	vector<Value> raw;
	for (const auto &q : bind_data.quantiles) {
		raw.emplace_back(q.val);
	}
	serializer.WriteProperty(100, "quantiles", raw);
	serializer.WriteProperty(101, "order", bind_data.order);
	serializer.WriteProperty(102, "desc", bind_data.desc);
}